

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O1

void __thiscall
Assimp::Blender::ConversionData::ConversionData(ConversionData *this,FileDatabase *db)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xd0);
  ::std::
  _Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::_M_initialize_map(&(this->materials_raw).
                       super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ,0);
  this->next_texture[0xf] = 0;
  this->next_texture[0x10] = 0;
  this->next_texture[0x11] = 0;
  this->next_texture[0x12] = 0;
  this->next_texture[0xb] = 0;
  this->next_texture[0xc] = 0;
  this->next_texture[0xd] = 0;
  this->next_texture[0xe] = 0;
  this->next_texture[7] = 0;
  this->next_texture[8] = 0;
  this->next_texture[9] = 0;
  this->next_texture[10] = 0;
  this->next_texture[3] = 0;
  this->next_texture[4] = 0;
  this->next_texture[5] = 0;
  this->next_texture[6] = 0;
  this->sentinel_cnt = 0;
  this->next_texture[0] = 0;
  this->next_texture[1] = 0;
  this->next_texture[2] = 0;
  this->db = db;
  return;
}

Assistant:

ConversionData(const FileDatabase& db)
            : sentinel_cnt()
            , next_texture()
            , db(db)
        {}